

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O3

void Search::iterative_deepening(position *p,U16 depth,bool silent)

{
  __normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_> __seed;
  Rootmove *pRVar1;
  Score SVar2;
  undefined8 extraout_RAX;
  short sVar3;
  ulong uVar4;
  Score *alpha;
  short sVar5;
  undefined7 in_register_00000011;
  int iVar6;
  node *this;
  position *stack_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Score SVar10;
  long lVar11;
  Score SVar12;
  Move pv [68];
  node stack [68];
  U16 local_1044;
  short local_1042;
  uint local_1040;
  undefined4 local_103c;
  undefined4 local_1038;
  Score local_1034;
  position *local_1030;
  uint local_1028;
  Score local_1024;
  undefined4 local_1020;
  uint local_101c;
  Rootmoves *local_1018;
  ulong local_1010;
  undefined1 local_1008 [296];
  undefined2 local_ee0;
  node local_ea8 [66];
  
  local_1020 = (undefined4)CONCAT71(in_register_00000011,silent);
  iVar6 = (p->params).fixed_depth;
  if (0 < iVar6) {
    depth = (U16)iVar6;
  }
  lVar11 = 0;
  local_1030 = p;
  do {
    this = (node *)(local_1008 + lVar11 + 0xf0);
    node::node(this);
    lVar11 = lVar11 + 0x38;
  } while (lVar11 != 0xee0);
  lVar11 = 2;
  do {
    *(undefined2 *)(local_1008 + lVar11 + 0x1e) = 0;
    local_1008[lVar11 + 0x20] = 0x11;
    lVar11 = lVar11 + 3;
  } while (lVar11 != 0xce);
  local_ea8[0].pv = (Move *)((long)local_1008 + 0x20);
  uVar4 = (ulong)local_1030->thread_id;
  if (local_1030->thread_id < depth) {
    local_1028 = (uint)depth;
    local_1018 = &local_1030->root_moves;
    SVar2 = ninf;
    local_1042 = 10000;
    iVar6 = 0xd8f0;
    uVar7 = CONCAT62((int6)((ulong)this >> 0x10),0x41);
    do {
      if (UCI_SIGNALS.stop != false) break;
      local_1040 = (int)uVar4 + 1;
      uVar8 = 0;
      local_ea8[0].ply = 0;
      local_ee0 = 0;
      local_1008._240_2_ = 0;
      hashHits = 0;
      local_101c = local_1040 & 0xffff;
      uVar9 = 0;
      local_1008._24_8_ = uVar4;
      while( true ) {
        if ((int)local_1008._24_8_ == 0) {
          local_103c = (undefined4)uVar9;
          local_1038 = (undefined4)uVar8;
        }
        else {
          iVar6 = SVar2 + 0xffffffdf;
          if ((short)iVar6 < -9999) {
            iVar6 = 0xd8f0;
          }
          local_1042 = (short)SVar2 + 0x21;
          sVar3 = local_1042;
          if (9999 < local_1042) {
            sVar3 = 10000;
          }
          if ((uVar8 & 1) != 0) {
            local_1042 = sVar3 + (short)uVar7;
          }
          if (9999 < local_1042) {
            local_1042 = 10000;
          }
          if (((uVar9 & 1) != 0) && (iVar6 = iVar6 - (int)uVar7, (short)iVar6 < -9999)) {
            iVar6 = 0xd8f0;
          }
          local_1038 = 0;
          local_103c = 0;
        }
        selDepth = 0;
        SVar12 = (Score)(short)iVar6;
        SVar10 = (Score)local_1042;
        stack_00 = local_1030;
        local_1010 = uVar7;
        SVar2 = search<(Nodetype)0>(local_1030,(short)iVar6,local_1042,(U16)local_101c,local_ea8);
        __seed._M_current =
             (local_1030->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
             _M_impl.super__Vector_impl_data._M_start;
        pRVar1 = (local_1030->root_moves).super__Vector_base<Rootmove,_std::allocator<Rootmove>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        local_1024 = SVar2;
        if (__seed._M_current != pRVar1) {
          lVar11 = ((long)pRVar1 - (long)__seed._M_current >> 3) * -0x3333333333333333;
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_>,_Rootmove>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_>,_Rootmove>
                               *)local_1008,__seed,(lVar11 - (lVar11 + 1 >> 0x3f)) + 1 >> 1);
          if ((pointer)local_1008._16_8_ == (pointer)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<Rootmove*,std::vector<Rootmove,std::allocator<Rootmove>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (__seed._M_current,pRVar1);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<Rootmove*,std::vector<Rootmove,std::allocator<Rootmove>>>,Rootmove*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (__seed._M_current,pRVar1,local_1008._16_8_,local_1008._8_8_);
          }
          stack_00 = (position *)local_1008;
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_>,_Rootmove>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_>,_Rootmove>
                      *)stack_00);
        }
        if ((UCI_SIGNALS.stop != false) || ((SVar12 < SVar2 && (SVar2 < SVar10)))) break;
        alpha = (Score *)local_1008;
        local_1044 = (U16)local_1040;
        local_1034 = SVar10;
        local_1008._0_4_ = SVar12;
        readout_pv((node *)stack_00,local_1018,&local_1024,alpha,&local_1034,&local_1044);
        sVar3 = (short)local_1010;
        sVar5 = sVar3 + 3;
        if (-1 < sVar3) {
          sVar5 = sVar3;
        }
        uVar7 = (ulong)(uint)(((int)sVar5 >> 2) + (int)local_1010);
        uVar8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),SVar12 < SVar2 | (byte)local_1038) &
                0xffffffff;
        uVar9 = CONCAT71((int7)((ulong)alpha >> 8),SVar2 <= SVar12 | (byte)local_103c) & 0xffffffff;
      }
      if ((local_1030->thread_id == 0) && (UCI_SIGNALS.stop == false)) {
        if ((char)local_1020 == '\0') {
          local_1044 = (U16)local_1040;
          local_1034 = SVar10;
          local_1008._0_4_ = SVar12;
          readout_pv((node *)stack_00,local_1018,&local_1024,(Score *)local_1008,&local_1034,
                     &local_1044);
        }
        if (local_1040 == local_1028) {
          UCI_SIGNALS.stop = true;
          break;
        }
      }
      uVar4 = (ulong)local_1040;
      uVar7 = local_1010;
    } while (local_1040 != local_1028);
  }
  lVar11 = 0xec8;
  do {
    History::destroyBmHistory(*(bmHistory **)(local_1008 + lVar11 + 0xf0));
    lVar11 = lVar11 + -0x38;
  } while (lVar11 != -0x18);
  return;
}

Assistant:

void Search::iterative_deepening(position& p, U16 depth, bool silent) {
	int16 alpha = ninf;
	int16 beta = inf;
	int16 delta = 65;
	int16 smallDelta = 33;
	Score eval = ninf;


	if (p.params.fixed_depth > 0) {
		depth = p.params.fixed_depth;
	}

	const unsigned stack_size = 64 + 4;
	node stack[stack_size];
	Move pv[Depth::MAX_PLY + 4];

	(stack + 2)->pv = pv;


	// Main iterative deepening loop
	for (unsigned id = 1 + p.id(); id <= depth; ++id) {

		if (UCI_SIGNALS.stop)
			break;

		(stack+0)->ply = (stack + 1)->ply = (stack + 2)->ply = 0;

		auto failLow = false;
		auto failHigh = false;
		hashHits = 0;

		// 1. aspiration window search
		while (true) {
			if (id >= 2) {
				alpha = std::max(int16(eval - smallDelta), int16(ninf));
				beta = std::min(int16(eval + smallDelta), int16(inf));
				if (failLow) {
					beta = std::min(int16(beta + delta), int16(inf));
					failLow = false;
				}
				if (failHigh) {
					alpha = std::max(int16(alpha - delta), int16(ninf));
					failHigh = false;
				}
			}

			selDepth = 0;
			eval = search<root>(p, alpha, beta, id, stack + 2);

			// bring the best move to the front of the root move array
			std::stable_sort(p.root_moves.begin(), p.root_moves.end());


			if (UCI_SIGNALS.stop)
				break;

			if ((eval <= alpha || eval >= beta))
				readout_pv(stack, p.root_moves, eval, Score(alpha), Score(beta), id);

			if (eval <= alpha) {
				delta += delta / 4;
				failHigh = true;
			}
			else if (eval >= beta) {
				delta += delta / 4;
				failLow = true;
			}
			else break;
		}


		// 2. Print PV to UI
		if (main_thread(p) && !UCI_SIGNALS.stop) {

			if (!silent)
				readout_pv(stack, p.root_moves, eval, Score(alpha), Score(beta), id);

			if (id == depth) {
				UCI_SIGNALS.stop = true;
				break;
			}
		}
	}
}